

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O0

uint __thiscall
pktalloc::CustomBitSet<2048U>::FindFirstClear(CustomBitSet<2048U> *this,uint bitStart)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint i;
  uint offset;
  WordT word;
  uint wordStart;
  uint bitStart_local;
  CustomBitSet<2048U> *this_local;
  uint local_14;
  
  i = bitStart >> 6;
  uVar2 = (*(ulong *)(this + (ulong)i * 8) ^ 0xffffffffffffffff) >> ((byte)bitStart & 0x3f);
  if (uVar2 == 0) {
    do {
      i = i + 1;
      if (0x1f < i) {
        return 0x800;
      }
      uVar2 = *(ulong *)(this + (ulong)i * 8) ^ 0xffffffffffffffff;
    } while (uVar2 == 0);
    iVar3 = 0;
    for (uVar1 = uVar2; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
      iVar3 = iVar3 + 1;
    }
    iVar3 = iVar3 + 1;
    if (uVar2 == 0) {
      iVar3 = 0;
    }
    local_14 = i * 0x40 + iVar3 + -1;
  }
  else {
    offset = 0;
    if ((uVar2 & 1) == 0) {
      iVar3 = 0;
      for (uVar1 = uVar2; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
        iVar3 = iVar3 + 1;
      }
      iVar3 = iVar3 + 1;
      if (uVar2 == 0) {
        iVar3 = 0;
      }
      offset = iVar3 - 1;
    }
    local_14 = bitStart + offset;
  }
  return local_14;
}

Assistant:

unsigned FindFirstClear(const unsigned bitStart)
    {
        static_assert(kWordBits == 64, "Update this");

        const unsigned wordStart = bitStart / kWordBits;

        WordT word = ~Words[wordStart] >> (bitStart % kWordBits);
        if (word != 0)
        {
            unsigned offset = 0;
            if ((word & 1) == 0) {
                offset = TrailingZeros64(word);
            }
            return bitStart + offset;
        }

        for (unsigned i = wordStart + 1; i < kWords; ++i)
        {
            word = ~Words[i];
            if (word != 0) {
                return i * kWordBits + TrailingZeros64(word);
            }
        }

        return kValidBits;
    }